

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

void PVG_FT_Stroker_ExportBorder
               (PVG_FT_Stroker stroker,PVG_FT_StrokerBorder border,PVG_FT_Outline *outline)

{
  byte bVar1;
  PVG_FT_UInt PVar2;
  int iVar3;
  char *pcVar4;
  PVG_FT_Byte *pPVar5;
  PVG_FT_Error PVar6;
  int *piVar7;
  long lVar8;
  byte bVar9;
  PVG_FT_StrokeBorderRec *pPVar10;
  
  if ((border < 2) && (stroker->borders[border].valid != '\0')) {
    pPVar10 = stroker->borders + border;
    memcpy(outline->points + outline->n_points,stroker->borders[border].points,
           (ulong)pPVar10->num_points << 4);
    PVar2 = pPVar10->num_points;
    if (PVar2 != 0) {
      iVar3 = outline->n_points;
      pcVar4 = outline->tags;
      pPVar5 = stroker->borders[border].tags;
      lVar8 = 0;
      do {
        bVar1 = pPVar5[lVar8];
        bVar9 = bVar1 & 2;
        if ((bVar1 & 1) != 0) {
          bVar9 = 1;
        }
        pcVar4[lVar8 + iVar3] = bVar9;
        lVar8 = lVar8 + 1;
      } while (PVar2 != (PVG_FT_UInt)lVar8);
    }
    PVar2 = pPVar10->num_points;
    if (PVar2 != 0) {
      iVar3 = outline->n_points;
      piVar7 = outline->contours + outline->n_contours;
      pPVar5 = stroker->borders[border].tags;
      lVar8 = 0;
      do {
        if ((pPVar5[lVar8] & 8) != 0) {
          *piVar7 = iVar3 + (int)lVar8;
          piVar7 = piVar7 + 1;
          outline->n_contours = outline->n_contours + 1;
        }
        lVar8 = lVar8 + 1;
      } while (PVar2 != (PVG_FT_UInt)lVar8);
    }
    outline->n_points = outline->n_points + pPVar10->num_points;
    PVar6 = PVG_FT_Outline_Check(outline);
    if (PVar6 != 0) {
      __assert_fail("PVG_FT_Outline_Check(outline) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                    ,0x255,"void ft_stroke_border_export(PVG_FT_StrokeBorder, PVG_FT_Outline *)");
    }
  }
  return;
}

Assistant:

void PVG_FT_Stroker_ExportBorder(PVG_FT_Stroker       stroker,
                                PVG_FT_StrokerBorder border,
                                PVG_FT_Outline*      outline)
{
    if (border == PVG_FT_STROKER_BORDER_LEFT ||
        border == PVG_FT_STROKER_BORDER_RIGHT) {
        PVG_FT_StrokeBorder sborder = &stroker->borders[border];

        if (sborder->valid) ft_stroke_border_export(sborder, outline);
    }
}